

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.h
# Opt level: O3

void __thiscall
TPZFYsmpMatrix<std::complex<long_double>_>::SetData
          (TPZFYsmpMatrix<std::complex<long_double>_> *this,TPZVec<long> *IA,TPZVec<long> *JA,
          TPZVec<std::complex<long_double>_> *A)

{
  long lVar1;
  
  lVar1 = (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
  if (IA->fNElements != lVar1 + 1) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzysmp.h",
               0x10f);
  }
  if (JA->fNElements != IA->fStore[lVar1]) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzysmp.h",
               0x113);
  }
  TPZVec<long>::operator=(&this->fIA,IA);
  TPZVec<long>::operator=(&this->fJA,JA);
  TPZVec<std::complex<long_double>_>::operator=(&this->fA,A);
  return;
}

Assistant:

inline void TPZFYsmpMatrix<TVar>::SetData( TPZVec<int64_t> &IA, TPZVec<int64_t> &JA, TPZVec<TVar> &A ){
    
    if (IA.size() != this->Rows() + 1 ) {
        DebugStop();
    }
    
    if (JA.size() != IA[this->Rows()]) {
        DebugStop();
    }
    
    fIA = IA;
    fJA = JA;
    fA = A;
}